

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

int gmtime_s(tm *tmDest,time_t *sourceTime)

{
  time_t *sourceTime_local;
  tm *tmDest_local;
  
  if (tmDest == (tm *)0x0) {
    tmDest_local._4_4_ = 0x16;
  }
  else if ((sourceTime == (time_t *)0x0) || (*sourceTime < 0)) {
    memset(tmDest,0xff,0x38);
    tmDest_local._4_4_ = 0x16;
  }
  else {
    gmtime(sourceTime);
    tmDest_local._4_4_ = 0;
  }
  return tmDest_local._4_4_;
}

Assistant:

int gmtime_s( struct tm* tmDest, const std::time_t* sourceTime )
{
	if( tmDest == nullptr )
		return EINVAL;

	if( sourceTime == nullptr || *sourceTime < 0 )
	{
		std::memset(tmDest, 0xff, sizeof(tm));
		return EINVAL;
	}

	tmDest = gmtime( sourceTime );
	return 0;
}